

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aligned.h
# Opt level: O2

void __thiscall
intgemm::AlignedVector<float>::AlignedVector<float*>
          (AlignedVector<float> *this,float *first,float *last)

{
  AlignedVector(this,(long)last - (long)first >> 2,0x40);
  if ((long)last - (long)first != 0) {
    memmove(this->mem_,first,(long)last - (long)first);
    return;
  }
  return;
}

Assistant:

AlignedVector(InputIt first, InputIt last) 
      : AlignedVector(last - first) {
      std::copy(first, last, begin());
    }